

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::attachmentQueryDefaultFboTest(TestContext *testCtx,Context *ctx)

{
  undefined4 local_1c;
  Context *pCStack_18;
  GLint unused;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  local_1c = 0xffffffff;
  pCStack_18 = ctx;
  ctx_local = (Context *)testCtx;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8ce0,0x8cd0,&local_1c);
  checkEitherError((TestContext *)ctx_local,pCStack_18,0x500,0x502);
  (*pCStack_18->_vptr_Context[0x22])(pCStack_18,0x8d40,0x8ce0,0x8cd1,&local_1c);
  checkEitherError((TestContext *)ctx_local,pCStack_18,0x500,0x502);
  (*pCStack_18->_vptr_Context[0x22])(pCStack_18,0x8d40,0x8ce0,0x8cd2,&local_1c);
  checkEitherError((TestContext *)ctx_local,pCStack_18,0x500,0x502);
  (*pCStack_18->_vptr_Context[0x22])(pCStack_18,0x8d40,0x8ce0,0x8cd3,&local_1c);
  checkEitherError((TestContext *)ctx_local,pCStack_18,0x500,0x502);
  return;
}

Assistant:

static void attachmentQueryDefaultFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	// Check that proper error codes are returned
	GLint unused = -1;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
}